

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testNNMissingLayer(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *this;
  FeatureType *pFVar2;
  ArrayFeatureType *this_00;
  ostream *poVar3;
  undefined1 local_90 [8];
  Result res;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(this,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  res.m_message.field_2._8_8_ = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)res.m_message.field_2._8_8_,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)res.m_message.field_2._8_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::validate<(MLModelType)500>((Result *)local_90,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_90);
  if (m1._oneof_case_[0]._0_1_) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x251);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_90);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testNNMissingLayer() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;
}